

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void PaUtil_BeginBufferProcessing
               (PaUtilBufferProcessor *bp,PaStreamCallbackTimeInfo *timeInfo,
               PaStreamCallbackFlags callbackStatusFlags)

{
  double dVar1;
  
  bp->timeInfo = timeInfo;
  dVar1 = bp->samplePeriod;
  timeInfo->inputBufferAdcTime =
       timeInfo->inputBufferAdcTime -
       (((double)CONCAT44(0x45300000,(int)(bp->framesInTempInputBuffer >> 0x20)) -
        1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)bp->framesInTempInputBuffer) - 4503599627370496.0)) * dVar1
  ;
  timeInfo->outputBufferDacTime =
       (((double)CONCAT44(0x45300000,(int)(bp->framesInTempOutputBuffer >> 0x20)) -
        1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)bp->framesInTempOutputBuffer) - 4503599627370496.0)) *
       dVar1 + timeInfo->outputBufferDacTime;
  bp->callbackStatusFlags = callbackStatusFlags;
  bp->hostInputFrameCount[1] = 0;
  bp->hostOutputFrameCount[1] = 0;
  return;
}

Assistant:

void PaUtil_BeginBufferProcessing( PaUtilBufferProcessor* bp,
        PaStreamCallbackTimeInfo* timeInfo, PaStreamCallbackFlags callbackStatusFlags )
{
    bp->timeInfo = timeInfo;

    /* the first streamCallback will be called to process samples which are
        currently in the input buffer before the ones starting at the timeInfo time */

    bp->timeInfo->inputBufferAdcTime -= bp->framesInTempInputBuffer * bp->samplePeriod;

    /* We just pass through timeInfo->currentTime provided by the caller. This is
        not strictly conformant to the word of the spec, since the buffer processor
        might call the callback multiple times, and we never refresh currentTime. */

    /* the first streamCallback will be called to generate samples which will be
        outputted after the frames currently in the output buffer have been
        outputted. */
    bp->timeInfo->outputBufferDacTime += bp->framesInTempOutputBuffer * bp->samplePeriod;

    bp->callbackStatusFlags = callbackStatusFlags;

    bp->hostInputFrameCount[1] = 0;
    bp->hostOutputFrameCount[1] = 0;
}